

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void * __thiscall
pugi::impl::anon_unknown_0::xpath_allocator::reallocate
          (xpath_allocator *this,void *ptr,size_t old_size,size_t new_size)

{
  xpath_memory_block *pxVar1;
  ulong uVar2;
  undefined1 *__dest;
  ulong size;
  ulong __n;
  
  __n = old_size + 7 & 0xfffffffffffffff8;
  size = new_size + 7 & 0xfffffffffffffff8;
  if (ptr != (void *)0x0) {
    if ((char *)((long)ptr + __n) != (this->_root->field_2).data + this->_root_size) {
      __assert_fail("ptr == 0 || static_cast<char*>(ptr) + old_size == &_root->data[0] + _root_size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x1da6,
                    "void *pugi::impl::(anonymous namespace)::xpath_allocator::reallocate(void *, size_t, size_t)"
                   );
    }
    uVar2 = (this->_root_size - __n) + size;
    if (uVar2 <= this->_root->capacity) {
      this->_root_size = uVar2;
      return ptr;
    }
  }
  __dest = (undefined1 *)allocate(this,size);
  if (__dest != (undefined1 *)0x0 && ptr != (void *)0x0) {
    if (size < __n) {
      __assert_fail("new_size >= old_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x1db7,
                    "void *pugi::impl::(anonymous namespace)::xpath_allocator::reallocate(void *, size_t, size_t)"
                   );
    }
    memcpy(__dest,ptr,__n);
    if (&this->_root->field_2 != (anon_union_4096_2_e9978466_for_xpath_memory_block_2 *)__dest) {
      __assert_fail("_root->data == result",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x1dbb,
                    "void *pugi::impl::(anonymous namespace)::xpath_allocator::reallocate(void *, size_t, size_t)"
                   );
    }
    pxVar1 = this->_root->next;
    if (pxVar1 == (xpath_memory_block *)0x0) {
      __assert_fail("_root->next",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x1dbc,
                    "void *pugi::impl::(anonymous namespace)::xpath_allocator::reallocate(void *, size_t, size_t)"
                   );
    }
    if ((&pxVar1->field_2 == (anon_union_4096_2_e9978466_for_xpath_memory_block_2 *)ptr) &&
       (pxVar1 = pxVar1->next, pxVar1 != (xpath_memory_block *)0x0)) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      this->_root->next = pxVar1;
    }
  }
  return __dest;
}

Assistant:

void* reallocate(void* ptr, size_t old_size, size_t new_size)
		{
			// round size up to block alignment boundary
			old_size = (old_size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);
			new_size = (new_size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);

			// we can only reallocate the last object
			assert(ptr == 0 || static_cast<char*>(ptr) + old_size == &_root->data[0] + _root_size);

			// try to reallocate the object inplace
			if (ptr && _root_size - old_size + new_size <= _root->capacity)
			{
				_root_size = _root_size - old_size + new_size;
				return ptr;
			}

			// allocate a new block
			void* result = allocate(new_size);
			if (!result) return 0;

			// we have a new block
			if (ptr)
			{
				// copy old data (we only support growing)
				assert(new_size >= old_size);
				memcpy(result, ptr, old_size);

				// free the previous page if it had no other objects
				assert(_root->data == result);
				assert(_root->next);

				if (_root->next->data == ptr)
				{
					// deallocate the whole page, unless it was the first one
					xpath_memory_block* next = _root->next->next;

					if (next)
					{
						xml_memory::deallocate(_root->next);
						_root->next = next;
					}
				}
			}

			return result;
		}